

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

void xe::writeResultItem(Item *item,Writer *dst)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  const_reference bytes;
  size_type sVar4;
  char *pcVar5;
  ulong uVar6;
  Item *pIVar7;
  Writer *pWVar8;
  Error *pEVar9;
  Base64Formatter BVar10;
  BeginElement local_14a0;
  Writer *local_1480;
  SampleValue *value;
  undefined1 local_1470 [4];
  int ndx_6;
  Writer *local_1450;
  Sample *sample;
  Attribute local_1408;
  Attribute local_13c8;
  Attribute local_1388;
  BeginElement local_1348;
  Writer *local_1328;
  ValueInfo *info_1;
  undefined1 local_1318 [4];
  int ndx_5;
  Writer *local_12f8;
  SampleInfo *info;
  undefined1 local_12e8 [4];
  int ndx_4;
  Attribute local_12a8;
  BeginElement local_1268;
  Writer *local_1248;
  SampleList *list;
  undefined1 local_1238 [4];
  int ndx_3;
  Attribute local_11f8;
  BeginElement local_11b8;
  Writer *local_1198;
  EglConfigSet *configSet;
  Attribute local_1170;
  string local_1130;
  Attribute local_1110;
  string local_10d0;
  Attribute local_10b0;
  Attribute local_1070;
  Attribute local_1030;
  string local_ff0;
  Attribute local_fd0;
  string local_f90;
  Attribute local_f70;
  string local_f30;
  Attribute local_f10;
  Attribute local_ed0;
  Attribute local_e90;
  string local_e50;
  Attribute local_e30;
  string local_df0;
  Attribute local_dd0;
  string local_d90;
  Attribute local_d70;
  string local_d30;
  Attribute local_d10;
  string local_cd0;
  Attribute local_cb0;
  string local_c70;
  Attribute local_c50;
  string local_c10;
  Attribute local_bf0;
  Attribute local_bb0;
  string local_b70;
  Attribute local_b50;
  Attribute local_b10;
  Attribute local_ad0;
  Attribute local_a90;
  Attribute local_a50;
  string local_a10;
  Attribute local_9f0;
  string local_9b0;
  Attribute local_990;
  string local_950;
  Attribute local_930;
  string local_8f0;
  Attribute local_8d0;
  string local_890;
  Attribute local_870;
  string local_830;
  Attribute local_810;
  string local_7d0;
  Attribute local_7b0;
  BeginElement local_770;
  Writer *local_750;
  EglConfig *config;
  Attribute local_708;
  Attribute local_6c8;
  BeginElement local_688;
  Writer *local_668;
  CompileInfo *compileInfo;
  int local_63c;
  undefined1 local_638 [4];
  int ndx_2;
  Attribute local_5f8;
  BeginElement local_5b8;
  Writer *local_598;
  Section *section;
  BeginElement local_570;
  BeginElement local_550;
  int local_52c;
  undefined1 local_528 [4];
  int ndx_1;
  BeginElement local_4e8;
  Writer *local_4c8;
  ShaderProgram *program;
  BeginElement local_480;
  undefined1 local_45a;
  allocator<char> local_459;
  string local_458;
  char *local_438;
  char *tagName;
  Shader *shader;
  undefined1 local_420 [4];
  int ndx;
  Attribute local_3e0;
  BeginElement local_3a0;
  Writer *local_380;
  ImageSet *imageSet;
  int local_370;
  Base64Formatter local_368;
  Attribute local_358;
  Attribute local_318;
  string local_2d8;
  Attribute local_2b8;
  string local_278;
  Attribute local_258;
  Attribute local_218;
  Attribute local_1d8;
  BeginElement local_198;
  Writer *local_178;
  Image *image;
  Attribute local_130;
  Attribute local_f0;
  Attribute local_b0;
  BeginElement local_70;
  Writer *local_50;
  Number *number;
  BeginElement local_38;
  Writer *local_18;
  Writer *dst_local;
  Item *item_local;
  
  local_18 = dst;
  dst_local = (Writer *)item;
  TVar2 = ri::Item::getType(item);
  pWVar8 = local_18;
  switch(TVar2) {
  case TYPE_RESULT:
    break;
  case TYPE_TEXT:
    xml::Writer::BeginElement::BeginElement(&local_38,"Text");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_38);
    pWVar8 = xml::Writer::operator<<
                       (pWVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(dst_local->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement(&local_38);
    break;
  case TYPE_NUMBER:
    local_50 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_70,"Number");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_70);
    xml::Writer::Attribute::Attribute(&local_b0,"Name",(string *)&(local_50->m_dataBuf).field_0x8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_b0);
    xml::Writer::Attribute::Attribute
              (&local_f0,"Description",(string *)&(local_50->m_dataBuf).field_0x28);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_f0);
    xml::Writer::Attribute::Attribute(&local_130,"Unit",(string *)&local_50->m_dataStr);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_130);
    xml::Writer::Attribute::Attribute((Attribute *)&image,"Tag",(string *)&local_50->field_0x70);
    pWVar8 = xml::Writer::operator<<(pWVar8,(Attribute *)&image);
    pWVar8 = xml::Writer::operator<<(pWVar8,(NumericValue *)&local_50->field_0x90);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::Attribute::~Attribute((Attribute *)&image);
    xml::Writer::Attribute::~Attribute(&local_130);
    xml::Writer::Attribute::~Attribute(&local_f0);
    xml::Writer::Attribute::~Attribute(&local_b0);
    xml::Writer::BeginElement::~BeginElement(&local_70);
    break;
  case TYPE_IMAGE:
    local_178 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_198,"Image");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_198);
    xml::Writer::Attribute::Attribute(&local_1d8,"Name",(string *)&(local_178->m_dataBuf).field_0x8)
    ;
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1d8);
    xml::Writer::Attribute::Attribute
              (&local_218,"Description",(string *)&(local_178->m_dataBuf).field_0x28);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_218);
    de::toString<int>(&local_278,(int *)&local_178->m_dataStr);
    xml::Writer::Attribute::Attribute(&local_258,"Width",&local_278);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_258);
    de::toString<int>(&local_2d8,(int *)&local_178->field_0x54);
    xml::Writer::Attribute::Attribute(&local_2b8,"Height",&local_2d8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_2b8);
    pcVar5 = getImageFormatName(*(Format *)&local_178->field_0x58);
    xml::Writer::Attribute::Attribute(&local_318,"Format",pcVar5);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_318);
    pcVar5 = getImageCompressionName(*(Compression *)&local_178->field_0x5c);
    xml::Writer::Attribute::Attribute(&local_358,"CompressionMode",pcVar5);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_358);
    bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &local_178->field_0x60,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &local_178->field_0x60);
    BVar10 = toBase64(bytes,(int)sVar4);
    imageSet = (ImageSet *)BVar10.data;
    local_370 = BVar10.numBytes;
    local_368.data = (deUint8 *)imageSet;
    local_368.numBytes = local_370;
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_368);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::Attribute::~Attribute(&local_358);
    xml::Writer::Attribute::~Attribute(&local_318);
    xml::Writer::Attribute::~Attribute(&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    xml::Writer::Attribute::~Attribute(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    xml::Writer::Attribute::~Attribute(&local_218);
    xml::Writer::Attribute::~Attribute(&local_1d8);
    xml::Writer::BeginElement::~BeginElement(&local_198);
    break;
  case TYPE_IMAGESET:
    local_380 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_3a0,"ImageSet");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_3a0);
    xml::Writer::Attribute::Attribute(&local_3e0,"Name",(string *)&(local_380->m_dataBuf).field_0x8)
    ;
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_3e0);
    xml::Writer::Attribute::Attribute
              ((Attribute *)local_420,"Description",(string *)&(local_380->m_dataBuf).field_0x28);
    xml::Writer::operator<<(pWVar8,(Attribute *)local_420);
    xml::Writer::Attribute::~Attribute((Attribute *)local_420);
    xml::Writer::Attribute::~Attribute(&local_3e0);
    xml::Writer::BeginElement::~BeginElement(&local_3a0);
    for (shader._4_4_ = 0; iVar1 = shader._4_4_,
        iVar3 = ri::List::getNumItems((List *)&local_380->m_dataStr), iVar1 < iVar3;
        shader._4_4_ = shader._4_4_ + 1) {
      pIVar7 = ri::List::getItem((List *)&local_380->m_dataStr,shader._4_4_);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SHADER:
    tagName = (char *)dst_local;
    local_438 = (char *)0x0;
    switch(*(undefined4 *)&(dst_local->m_dataBuf).field_0x4) {
    case 0:
      local_438 = "VertexShader";
      break;
    case 1:
      local_438 = "FragmentShader";
      break;
    case 2:
      local_438 = "GeometryShader";
      break;
    case 3:
      local_438 = "TessControlShader";
      break;
    case 4:
      local_438 = "TessEvaluationShader";
      break;
    case 5:
      local_438 = "ComputeShader";
      break;
    default:
      local_45a = 1;
      pEVar9 = (Error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"Unknown shader type",&local_459);
      Error::Error(pEVar9,&local_458);
      local_45a = 0;
      __cxa_throw(pEVar9,&Error::typeinfo,Error::~Error);
    }
    xml::Writer::BeginElement::BeginElement(&local_480,local_438);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_480);
    pcVar5 = getStatusName((bool)(tagName[0x10] & 1));
    xml::Writer::Attribute::Attribute((Attribute *)&program,"CompileStatus",pcVar5);
    xml::Writer::operator<<(pWVar8,(Attribute *)&program);
    xml::Writer::Attribute::~Attribute((Attribute *)&program);
    xml::Writer::BeginElement::~BeginElement(&local_480);
    writeResultItem((Item *)(tagName + 0x18),local_18);
    writeResultItem((Item *)(tagName + 0x48),local_18);
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SHADERPROGRAM:
    local_4c8 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_4e8,"ShaderProgram");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_4e8);
    pcVar5 = getStatusName((bool)((local_4c8->m_dataBuf).field_0x20 & 1));
    xml::Writer::Attribute::Attribute((Attribute *)local_528,"LinkStatus",pcVar5);
    xml::Writer::operator<<(pWVar8,(Attribute *)local_528);
    xml::Writer::Attribute::~Attribute((Attribute *)local_528);
    xml::Writer::BeginElement::~BeginElement(&local_4e8);
    writeResultItem((Item *)&(local_4c8->m_dataBuf).field_0x28,local_18);
    for (local_52c = 0; iVar1 = local_52c,
        iVar3 = ri::List::getNumItems((List *)&(local_4c8->m_dataBuf).field_0x8), iVar1 < iVar3;
        local_52c = local_52c + 1) {
      pIVar7 = ri::List::getItem((List *)&(local_4c8->m_dataBuf).field_0x8,local_52c);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SHADERSOURCE:
    xml::Writer::BeginElement::BeginElement(&local_550,"ShaderSource");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_550);
    pWVar8 = xml::Writer::operator<<
                       (pWVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(dst_local->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement(&local_550);
    break;
  case TYPE_SPIRVSOURCE:
    xml::Writer::BeginElement::BeginElement(&local_570,"SpirVAssemblySource");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_570);
    pWVar8 = xml::Writer::operator<<
                       (pWVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(dst_local->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement(&local_570);
    break;
  case TYPE_INFOLOG:
    xml::Writer::BeginElement::BeginElement((BeginElement *)&section,"InfoLog");
    pWVar8 = xml::Writer::operator<<(pWVar8,(BeginElement *)&section);
    pWVar8 = xml::Writer::operator<<
                       (pWVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(dst_local->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement((BeginElement *)&section);
    break;
  case TYPE_EGLCONFIG:
    local_750 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_770,"EglConfig");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_770);
    de::toString<int>(&local_7d0,(int *)&(local_750->m_dataBuf).field_0x4);
    xml::Writer::Attribute::Attribute(&local_7b0,"BufferSize",&local_7d0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_7b0);
    de::toString<int>(&local_830,(int *)&(local_750->m_dataBuf).field_0x8);
    xml::Writer::Attribute::Attribute(&local_810,"RedSize",&local_830);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_810);
    de::toString<int>(&local_890,(int *)&(local_750->m_dataBuf).field_0xc);
    xml::Writer::Attribute::Attribute(&local_870,"GreenSize",&local_890);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_870);
    de::toString<int>(&local_8f0,(int *)&(local_750->m_dataBuf).field_0x10);
    xml::Writer::Attribute::Attribute(&local_8d0,"BlueSize",&local_8f0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_8d0);
    de::toString<int>(&local_950,(int *)&(local_750->m_dataBuf).field_0x14);
    xml::Writer::Attribute::Attribute(&local_930,"LuminanceSize",&local_950);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_930);
    de::toString<int>(&local_9b0,(int *)&(local_750->m_dataBuf).field_0x18);
    xml::Writer::Attribute::Attribute(&local_990,"AlphaSize",&local_9b0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_990);
    de::toString<int>(&local_a10,(int *)&(local_750->m_dataBuf).field_0x1c);
    xml::Writer::Attribute::Attribute(&local_9f0,"AlphaMaskSize",&local_a10);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_9f0);
    pcVar5 = getBoolName((bool)((local_750->m_dataBuf).field_0x20 & 1));
    xml::Writer::Attribute::Attribute(&local_a50,"BindToTextureRGB",pcVar5);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_a50);
    pcVar5 = getBoolName((bool)((local_750->m_dataBuf).field_0x21 & 1));
    xml::Writer::Attribute::Attribute(&local_a90,"BindToTextureRGBA",pcVar5);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_a90);
    xml::Writer::Attribute::Attribute
              (&local_ad0,"ColorBufferType",(string *)&(local_750->m_dataBuf).field_0x28);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_ad0);
    xml::Writer::Attribute::Attribute(&local_b10,"ConfigCaveat",(string *)&local_750->m_dataStr);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_b10);
    de::toString<int>(&local_b70,(int *)&local_750->field_0x70);
    xml::Writer::Attribute::Attribute(&local_b50,"ConfigID",&local_b70);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_b50);
    xml::Writer::Attribute::Attribute(&local_bb0,"Conformant",(string *)&local_750->field_0x78);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_bb0);
    de::toString<int>(&local_c10,(int *)&local_750->field_0x98);
    xml::Writer::Attribute::Attribute(&local_bf0,"DepthSize",&local_c10);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_bf0);
    de::toString<int>(&local_c70,(int *)&local_750->field_0x9c);
    xml::Writer::Attribute::Attribute(&local_c50,"Level",&local_c70);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_c50);
    de::toString<int>(&local_cd0,(int *)&local_750->field_0xa0);
    xml::Writer::Attribute::Attribute(&local_cb0,"MaxPBufferWidth",&local_cd0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_cb0);
    de::toString<int>(&local_d30,(int *)&local_750->field_0xa4);
    xml::Writer::Attribute::Attribute(&local_d10,"MaxPBufferHeight",&local_d30);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_d10);
    de::toString<int>(&local_d90,(int *)&local_750->field_0xa8);
    xml::Writer::Attribute::Attribute(&local_d70,"MaxPBufferPixels",&local_d90);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_d70);
    de::toString<int>(&local_df0,(int *)&local_750->field_0xac);
    xml::Writer::Attribute::Attribute(&local_dd0,"MaxSwapInterval",&local_df0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_dd0);
    de::toString<int>(&local_e50,(int *)&local_750->field_0xb0);
    xml::Writer::Attribute::Attribute(&local_e30,"MinSwapInterval",&local_e50);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_e30);
    pcVar5 = getBoolName((bool)(local_750->field_0xb4 & 1));
    xml::Writer::Attribute::Attribute(&local_e90,"NativeRenderable",pcVar5);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_e90);
    xml::Writer::Attribute::Attribute(&local_ed0,"RenderableType",(string *)&local_750->field_0xb8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_ed0);
    de::toString<int>(&local_f30,(int *)&local_750->field_0xd8);
    xml::Writer::Attribute::Attribute(&local_f10,"SampleBuffers",&local_f30);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_f10);
    de::toString<int>(&local_f90,(int *)&local_750->field_0xdc);
    xml::Writer::Attribute::Attribute(&local_f70,"Samples",&local_f90);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_f70);
    de::toString<int>(&local_ff0,(int *)&local_750->field_0xe0);
    xml::Writer::Attribute::Attribute(&local_fd0,"StencilSize",&local_ff0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_fd0);
    xml::Writer::Attribute::Attribute(&local_1030,"SurfaceTypes",(string *)&local_750->field_0xe8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1030);
    xml::Writer::Attribute::Attribute
              (&local_1070,"TransparentType",(string *)&local_750->field_0x108);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1070);
    de::toString<int>(&local_10d0,(int *)&local_750->field_0x128);
    xml::Writer::Attribute::Attribute(&local_10b0,"TransparentRedValue",&local_10d0);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_10b0);
    de::toString<int>(&local_1130,(int *)&local_750->field_0x12c);
    xml::Writer::Attribute::Attribute(&local_1110,"TransparentGreenValue",&local_1130);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1110);
    de::toString<int>((string *)&configSet,(int *)&local_750->field_0x130);
    xml::Writer::Attribute::Attribute(&local_1170,"TransparentBlueValue",(string *)&configSet);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1170);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::Attribute::~Attribute(&local_1170);
    std::__cxx11::string::~string((string *)&configSet);
    xml::Writer::Attribute::~Attribute(&local_1110);
    std::__cxx11::string::~string((string *)&local_1130);
    xml::Writer::Attribute::~Attribute(&local_10b0);
    std::__cxx11::string::~string((string *)&local_10d0);
    xml::Writer::Attribute::~Attribute(&local_1070);
    xml::Writer::Attribute::~Attribute(&local_1030);
    xml::Writer::Attribute::~Attribute(&local_fd0);
    std::__cxx11::string::~string((string *)&local_ff0);
    xml::Writer::Attribute::~Attribute(&local_f70);
    std::__cxx11::string::~string((string *)&local_f90);
    xml::Writer::Attribute::~Attribute(&local_f10);
    std::__cxx11::string::~string((string *)&local_f30);
    xml::Writer::Attribute::~Attribute(&local_ed0);
    xml::Writer::Attribute::~Attribute(&local_e90);
    xml::Writer::Attribute::~Attribute(&local_e30);
    std::__cxx11::string::~string((string *)&local_e50);
    xml::Writer::Attribute::~Attribute(&local_dd0);
    std::__cxx11::string::~string((string *)&local_df0);
    xml::Writer::Attribute::~Attribute(&local_d70);
    std::__cxx11::string::~string((string *)&local_d90);
    xml::Writer::Attribute::~Attribute(&local_d10);
    std::__cxx11::string::~string((string *)&local_d30);
    xml::Writer::Attribute::~Attribute(&local_cb0);
    std::__cxx11::string::~string((string *)&local_cd0);
    xml::Writer::Attribute::~Attribute(&local_c50);
    std::__cxx11::string::~string((string *)&local_c70);
    xml::Writer::Attribute::~Attribute(&local_bf0);
    std::__cxx11::string::~string((string *)&local_c10);
    xml::Writer::Attribute::~Attribute(&local_bb0);
    xml::Writer::Attribute::~Attribute(&local_b50);
    std::__cxx11::string::~string((string *)&local_b70);
    xml::Writer::Attribute::~Attribute(&local_b10);
    xml::Writer::Attribute::~Attribute(&local_ad0);
    xml::Writer::Attribute::~Attribute(&local_a90);
    xml::Writer::Attribute::~Attribute(&local_a50);
    xml::Writer::Attribute::~Attribute(&local_9f0);
    std::__cxx11::string::~string((string *)&local_a10);
    xml::Writer::Attribute::~Attribute(&local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    xml::Writer::Attribute::~Attribute(&local_930);
    std::__cxx11::string::~string((string *)&local_950);
    xml::Writer::Attribute::~Attribute(&local_8d0);
    std::__cxx11::string::~string((string *)&local_8f0);
    xml::Writer::Attribute::~Attribute(&local_870);
    std::__cxx11::string::~string((string *)&local_890);
    xml::Writer::Attribute::~Attribute(&local_810);
    std::__cxx11::string::~string((string *)&local_830);
    xml::Writer::Attribute::~Attribute(&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    xml::Writer::BeginElement::~BeginElement(&local_770);
    break;
  case TYPE_EGLCONFIGSET:
    local_1198 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_11b8,"EglConfigSet");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_11b8);
    xml::Writer::Attribute::Attribute
              (&local_11f8,"Name",(string *)&(local_1198->m_dataBuf).field_0x8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_11f8);
    xml::Writer::Attribute::Attribute
              ((Attribute *)local_1238,"Description",(string *)&(local_1198->m_dataBuf).field_0x28);
    xml::Writer::operator<<(pWVar8,(Attribute *)local_1238);
    xml::Writer::Attribute::~Attribute((Attribute *)local_1238);
    xml::Writer::Attribute::~Attribute(&local_11f8);
    xml::Writer::BeginElement::~BeginElement(&local_11b8);
    for (list._4_4_ = 0; iVar1 = list._4_4_,
        iVar3 = ri::List::getNumItems((List *)&local_1198->m_dataStr), iVar1 < iVar3;
        list._4_4_ = list._4_4_ + 1) {
      pIVar7 = ri::List::getItem((List *)&local_1198->m_dataStr,list._4_4_);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SECTION:
    local_598 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_5b8,"Section");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_5b8);
    xml::Writer::Attribute::Attribute(&local_5f8,"Name",(string *)&(local_598->m_dataBuf).field_0x8)
    ;
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_5f8);
    xml::Writer::Attribute::Attribute
              ((Attribute *)local_638,"Description",(string *)&(local_598->m_dataBuf).field_0x28);
    xml::Writer::operator<<(pWVar8,(Attribute *)local_638);
    xml::Writer::Attribute::~Attribute((Attribute *)local_638);
    xml::Writer::Attribute::~Attribute(&local_5f8);
    xml::Writer::BeginElement::~BeginElement(&local_5b8);
    for (local_63c = 0; iVar1 = local_63c,
        iVar3 = ri::List::getNumItems((List *)&local_598->m_dataStr), iVar1 < iVar3;
        local_63c = local_63c + 1) {
      pIVar7 = ri::List::getItem((List *)&local_598->m_dataStr,local_63c);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_KERNELSOURCE:
    xml::Writer::BeginElement::BeginElement((BeginElement *)&compileInfo,"KernelSource");
    pWVar8 = xml::Writer::operator<<(pWVar8,(BeginElement *)&compileInfo);
    pWVar8 = xml::Writer::operator<<
                       (pWVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(dst_local->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement((BeginElement *)&compileInfo);
    break;
  case TYPE_COMPILEINFO:
    local_668 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_688,"CompileInfo");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_688);
    xml::Writer::Attribute::Attribute(&local_6c8,"Name",(string *)&(local_668->m_dataBuf).field_0x8)
    ;
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_6c8);
    xml::Writer::Attribute::Attribute
              (&local_708,"Description",(string *)&(local_668->m_dataBuf).field_0x28);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_708);
    pcVar5 = getStatusName((bool)((byte)local_668->m_dataStr & 1));
    xml::Writer::Attribute::Attribute((Attribute *)&config,"CompileStatus",pcVar5);
    xml::Writer::operator<<(pWVar8,(Attribute *)&config);
    xml::Writer::Attribute::~Attribute((Attribute *)&config);
    xml::Writer::Attribute::~Attribute(&local_708);
    xml::Writer::Attribute::~Attribute(&local_6c8);
    xml::Writer::BeginElement::~BeginElement(&local_688);
    writeResultItem((Item *)&local_668->field_0x58,local_18);
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SAMPLELIST:
    local_1248 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_1268,"SampleList");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1268);
    xml::Writer::Attribute::Attribute
              (&local_12a8,"Name",(string *)&(local_1248->m_dataBuf).field_0x8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_12a8);
    xml::Writer::Attribute::Attribute
              ((Attribute *)local_12e8,"Description",(string *)&(local_1248->m_dataBuf).field_0x28);
    xml::Writer::operator<<(pWVar8,(Attribute *)local_12e8);
    xml::Writer::Attribute::~Attribute((Attribute *)local_12e8);
    xml::Writer::Attribute::~Attribute(&local_12a8);
    xml::Writer::BeginElement::~BeginElement(&local_1268);
    writeResultItem((Item *)&local_1248->m_dataStr,local_18);
    for (info._4_4_ = 0; iVar1 = info._4_4_,
        iVar3 = ri::List::getNumItems((List *)&local_1248->field_0x78), iVar1 < iVar3;
        info._4_4_ = info._4_4_ + 1) {
      pIVar7 = ri::List::getItem((List *)&local_1248->field_0x78,info._4_4_);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SAMPLEINFO:
    local_12f8 = dst_local;
    xml::Writer::BeginElement::BeginElement((BeginElement *)local_1318,"SampleInfo");
    xml::Writer::operator<<(pWVar8,(BeginElement *)local_1318);
    xml::Writer::BeginElement::~BeginElement((BeginElement *)local_1318);
    for (info_1._4_4_ = 0; iVar1 = info_1._4_4_,
        iVar3 = ri::List::getNumItems((List *)&(local_12f8->m_dataBuf).field_0x8), iVar1 < iVar3;
        info_1._4_4_ = info_1._4_4_ + 1) {
      pIVar7 = ri::List::getItem((List *)&(local_12f8->m_dataBuf).field_0x8,info_1._4_4_);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_VALUEINFO:
    local_1328 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_1348,"ValueInfo");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1348);
    xml::Writer::Attribute::Attribute
              (&local_1388,"Name",(string *)&(local_1328->m_dataBuf).field_0x8);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_1388);
    xml::Writer::Attribute::Attribute
              (&local_13c8,"Description",(string *)&(local_1328->m_dataBuf).field_0x28);
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_13c8);
    pcVar5 = getSampleValueTagName(*(ValueTag *)&local_1328->field_0x70);
    xml::Writer::Attribute::Attribute(&local_1408,"Tag",pcVar5);
    xml::Writer::operator<<(pWVar8,&local_1408);
    xml::Writer::Attribute::~Attribute(&local_1408);
    xml::Writer::Attribute::~Attribute(&local_13c8);
    xml::Writer::Attribute::~Attribute(&local_1388);
    xml::Writer::BeginElement::~BeginElement(&local_1348);
    uVar6 = std::__cxx11::string::empty();
    pWVar8 = local_18;
    if ((uVar6 & 1) == 0) {
      xml::Writer::Attribute::Attribute
                ((Attribute *)&sample,"Unit",(string *)&local_1328->m_dataStr);
      xml::Writer::operator<<(pWVar8,(Attribute *)&sample);
      xml::Writer::Attribute::~Attribute((Attribute *)&sample);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SAMPLE:
    local_1450 = dst_local;
    xml::Writer::BeginElement::BeginElement((BeginElement *)local_1470,"Sample");
    xml::Writer::operator<<(pWVar8,(BeginElement *)local_1470);
    xml::Writer::BeginElement::~BeginElement((BeginElement *)local_1470);
    for (value._4_4_ = 0; iVar1 = value._4_4_,
        iVar3 = ri::List::getNumItems((List *)&(local_1450->m_dataBuf).field_0x8), iVar1 < iVar3;
        value._4_4_ = value._4_4_ + 1) {
      pIVar7 = ri::List::getItem((List *)&(local_1450->m_dataBuf).field_0x8,value._4_4_);
      writeResultItem(pIVar7,local_18);
    }
    xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
    break;
  case TYPE_SAMPLEVALUE:
    local_1480 = dst_local;
    xml::Writer::BeginElement::BeginElement(&local_14a0,"Value");
    pWVar8 = xml::Writer::operator<<(pWVar8,&local_14a0);
    pWVar8 = xml::Writer::operator<<(pWVar8,(NumericValue *)&(local_1480->m_dataBuf).field_0x8);
    xml::Writer::operator<<(pWVar8,(EndElementType *)&xml::Writer::EndElement);
    xml::Writer::BeginElement::~BeginElement(&local_14a0);
    break;
  default:
    pEVar9 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar9,"Unsupported result item","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestLogWriter.cpp"
                 ,0x1e9);
    __cxa_throw(pEVar9,&Error::typeinfo,Error::~Error);
  }
  return;
}

Assistant:

static void writeResultItem (const ri::Item& item, xml::Writer& dst)
{
	using xml::Writer;

	switch (item.getType())
	{
		case ri::TYPE_RESULT:
			// Ignored here, written at end.
			break;

		case ri::TYPE_TEXT:
			dst << Writer::BeginElement("Text") << static_cast<const ri::Text&>(item).text << Writer::EndElement;
			break;

		case ri::TYPE_NUMBER:
		{
			const ri::Number& number = static_cast<const ri::Number&>(item);
			dst << Writer::BeginElement("Number")
				<< Writer::Attribute("Name",		number.name)
				<< Writer::Attribute("Description",	number.description)
				<< Writer::Attribute("Unit",		number.unit)
				<< Writer::Attribute("Tag",			number.tag)
				<< number.value
				<< Writer::EndElement;
			break;
		}

		case ri::TYPE_IMAGE:
		{
			const ri::Image& image = static_cast<const ri::Image&>(item);
			dst << Writer::BeginElement("Image")
				<< Writer::Attribute("Name",			image.name)
				<< Writer::Attribute("Description",		image.description)
				<< Writer::Attribute("Width",			de::toString(image.width))
				<< Writer::Attribute("Height",			de::toString(image.height))
				<< Writer::Attribute("Format",			getImageFormatName(image.format))
				<< Writer::Attribute("CompressionMode",	getImageCompressionName(image.compression))
				<< toBase64(&image.data[0], (int)image.data.size())
				<< Writer::EndElement;
			break;
		}

		case ri::TYPE_IMAGESET:
		{
			const ri::ImageSet& imageSet = static_cast<const ri::ImageSet&>(item);
			dst << Writer::BeginElement("ImageSet")
				<< Writer::Attribute("Name",		imageSet.name)
				<< Writer::Attribute("Description",	imageSet.description);

			for (int ndx = 0; ndx < imageSet.images.getNumItems(); ndx++)
				writeResultItem(imageSet.images.getItem(ndx), dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SHADER:
		{
			const ri::Shader&	shader		= static_cast<const ri::Shader&>(item);
			const char*			tagName		= DE_NULL;

			switch (shader.shaderType)
			{
				case ri::Shader::SHADERTYPE_VERTEX:				tagName = "VertexShader";			break;
				case ri::Shader::SHADERTYPE_FRAGMENT:			tagName = "FragmentShader";			break;
				case ri::Shader::SHADERTYPE_GEOMETRY:			tagName = "GeometryShader";			break;
				case ri::Shader::SHADERTYPE_TESS_CONTROL:		tagName = "TessControlShader";		break;
				case ri::Shader::SHADERTYPE_TESS_EVALUATION:	tagName = "TessEvaluationShader";	break;
				case ri::Shader::SHADERTYPE_COMPUTE:			tagName = "ComputeShader";			break;
				default:
					throw Error("Unknown shader type");
			}

			dst << Writer::BeginElement(tagName)
				<< Writer::Attribute("CompileStatus",	getStatusName(shader.compileStatus));

			writeResultItem(shader.source, dst);
			writeResultItem(shader.infoLog, dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SHADERPROGRAM:
		{
			const ri::ShaderProgram& program = static_cast<const ri::ShaderProgram&>(item);
			dst << Writer::BeginElement("ShaderProgram")
				<< Writer::Attribute("LinkStatus",	getStatusName(program.linkStatus));

			writeResultItem(program.linkInfoLog, dst);

			for (int ndx = 0; ndx < program.shaders.getNumItems(); ndx++)
				writeResultItem(program.shaders.getItem(ndx), dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SHADERSOURCE:
			dst << Writer::BeginElement("ShaderSource") << static_cast<const ri::ShaderSource&>(item).source << Writer::EndElement;
			break;

		case ri::TYPE_SPIRVSOURCE:
			dst << Writer::BeginElement("SpirVAssemblySource") << static_cast<const ri::SpirVSource&>(item).source << Writer::EndElement;
			break;

		case ri::TYPE_INFOLOG:
			dst << Writer::BeginElement("InfoLog") << static_cast<const ri::InfoLog&>(item).log << Writer::EndElement;
			break;

		case ri::TYPE_SECTION:
		{
			const ri::Section& section = static_cast<const ri::Section&>(item);
			dst << Writer::BeginElement("Section")
				<< Writer::Attribute("Name",		section.name)
				<< Writer::Attribute("Description",	section.description);

			for (int ndx = 0; ndx < section.items.getNumItems(); ndx++)
				writeResultItem(section.items.getItem(ndx), dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_KERNELSOURCE:
			dst << Writer::BeginElement("KernelSource") << static_cast<const ri::KernelSource&>(item).source << Writer::EndElement;
			break;

		case ri::TYPE_COMPILEINFO:
		{
			const ri::CompileInfo& compileInfo = static_cast<const ri::CompileInfo&>(item);
			dst << Writer::BeginElement("CompileInfo")
				<< Writer::Attribute("Name",			compileInfo.name)
				<< Writer::Attribute("Description",		compileInfo.description)
				<< Writer::Attribute("CompileStatus",	getStatusName(compileInfo.compileStatus));

			writeResultItem(compileInfo.infoLog, dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_EGLCONFIG:
		{
			const ri::EglConfig& config = static_cast<const ri::EglConfig&>(item);
			dst << Writer::BeginElement("EglConfig")
				<< Writer::Attribute("BufferSize",				de::toString(config.bufferSize))
				<< Writer::Attribute("RedSize",					de::toString(config.redSize))
				<< Writer::Attribute("GreenSize",				de::toString(config.greenSize))
				<< Writer::Attribute("BlueSize",				de::toString(config.blueSize))
				<< Writer::Attribute("LuminanceSize",			de::toString(config.luminanceSize))
				<< Writer::Attribute("AlphaSize",				de::toString(config.alphaSize))
				<< Writer::Attribute("AlphaMaskSize",			de::toString(config.alphaMaskSize))
				<< Writer::Attribute("BindToTextureRGB",		getBoolName(config.bindToTextureRGB))
				<< Writer::Attribute("BindToTextureRGBA",		getBoolName(config.bindToTextureRGBA))
				<< Writer::Attribute("ColorBufferType",			config.colorBufferType)
				<< Writer::Attribute("ConfigCaveat",			config.configCaveat)
				<< Writer::Attribute("ConfigID",				de::toString(config.configID))
				<< Writer::Attribute("Conformant",				config.conformant)
				<< Writer::Attribute("DepthSize",				de::toString(config.depthSize))
				<< Writer::Attribute("Level",					de::toString(config.level))
				<< Writer::Attribute("MaxPBufferWidth",			de::toString(config.maxPBufferWidth))
				<< Writer::Attribute("MaxPBufferHeight",		de::toString(config.maxPBufferHeight))
				<< Writer::Attribute("MaxPBufferPixels",		de::toString(config.maxPBufferPixels))
				<< Writer::Attribute("MaxSwapInterval",			de::toString(config.maxSwapInterval))
				<< Writer::Attribute("MinSwapInterval",			de::toString(config.minSwapInterval))
				<< Writer::Attribute("NativeRenderable",		getBoolName(config.nativeRenderable))
				<< Writer::Attribute("RenderableType",			config.renderableType)
				<< Writer::Attribute("SampleBuffers",			de::toString(config.sampleBuffers))
				<< Writer::Attribute("Samples",					de::toString(config.samples))
				<< Writer::Attribute("StencilSize",				de::toString(config.stencilSize))
				<< Writer::Attribute("SurfaceTypes",			config.surfaceTypes)
				<< Writer::Attribute("TransparentType",			config.transparentType)
				<< Writer::Attribute("TransparentRedValue",		de::toString(config.transparentRedValue))
				<< Writer::Attribute("TransparentGreenValue",	de::toString(config.transparentGreenValue))
				<< Writer::Attribute("TransparentBlueValue",	de::toString(config.transparentBlueValue))
				<< Writer::EndElement;
			break;
		}

		case ri::TYPE_EGLCONFIGSET:
		{
			const ri::EglConfigSet& configSet = static_cast<const ri::EglConfigSet&>(item);
			dst << Writer::BeginElement("EglConfigSet")
				<< Writer::Attribute("Name",			configSet.name)
				<< Writer::Attribute("Description",		configSet.description);

			for (int ndx = 0; ndx < configSet.configs.getNumItems(); ndx++)
				writeResultItem(configSet.configs.getItem(ndx), dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SAMPLELIST:
		{
			const ri::SampleList& list = static_cast<const ri::SampleList&>(item);
			dst << Writer::BeginElement("SampleList")
				<< Writer::Attribute("Name",		list.name)
				<< Writer::Attribute("Description",	list.description);

			writeResultItem(list.sampleInfo, dst);

			for (int ndx = 0; ndx < list.samples.getNumItems(); ndx++)
				writeResultItem(list.samples.getItem(ndx), dst);

			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SAMPLEINFO:
		{
			const ri::SampleInfo& info = static_cast<const ri::SampleInfo&>(item);
			dst << Writer::BeginElement("SampleInfo");
			for (int ndx = 0; ndx < info.valueInfos.getNumItems(); ndx++)
				writeResultItem(info.valueInfos.getItem(ndx), dst);
			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_VALUEINFO:
		{
			const ri::ValueInfo& info = static_cast<const ri::ValueInfo&>(item);
			dst << Writer::BeginElement("ValueInfo")
				<< Writer::Attribute("Name",		info.name)
				<< Writer::Attribute("Description",	info.description)
				<< Writer::Attribute("Tag",			getSampleValueTagName(info.tag));
			if (!info.unit.empty())
				dst << Writer::Attribute("Unit", info.unit);
			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SAMPLE:
		{
			const ri::Sample& sample = static_cast<const ri::Sample&>(item);
			dst << Writer::BeginElement("Sample");
			for (int ndx = 0; ndx < sample.values.getNumItems(); ndx++)
				writeResultItem(sample.values.getItem(ndx), dst);
			dst << Writer::EndElement;
			break;
		}

		case ri::TYPE_SAMPLEVALUE:
		{
			const ri::SampleValue& value = static_cast<const ri::SampleValue&>(item);
			dst << Writer::BeginElement("Value")
				<< value.value
				<< Writer::EndElement;
			break;
		}

		default:
			XE_FAIL("Unsupported result item");
	}
}